

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O3

void CompareOnTheFlyBone(comparer_context *comp)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  string local_448;
  undefined1 local_428 [1032];
  
  comparer_context::push_elem(comp,"aiBone");
  paVar1 = &local_448.field_2;
  local_448._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"mName","");
  comparer_context::cmp<aiString>((aiString *)local_428,comp,&local_448);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != paVar1) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = local_428 + 0x10;
  local_428._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"mNumWeights","");
  comparer_context::cmp<unsigned_int>(comp,(string *)local_428);
  if ((pointer)local_428._0_8_ != pcVar2) {
    operator_delete((void *)local_428._0_8_,local_428._16_8_ + 1);
  }
  local_448._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"mOffsetMatrix","");
  comparer_context::cmp<aiMatrix4x4t<float>>((aiMatrix4x4 *)local_428,comp,&local_448);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != paVar1) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  local_428._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"mWeights","");
  comparer_context::cmp_bounds<aiVertexWeight>(comp,(string *)local_428);
  if ((pointer)local_428._0_8_ != pcVar2) {
    operator_delete((void *)local_428._0_8_,local_428._16_8_ + 1);
  }
  comparer_context::pop_elem(comp);
  return;
}

Assistant:

void CompareOnTheFlyBone(comparer_context& comp)    {
    scoped_chunk chunk(comp,"aiBone");
    comp.cmp<aiString>("mName");
    comp.cmp<uint32_t>("mNumWeights");
    comp.cmp<aiMatrix4x4>("mOffsetMatrix");

    comp.cmp_bounds<aiVertexWeight>("mWeights");
}